

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O1

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,WhileStatement *while_stmt,void *data)

{
  size_t *psVar1;
  SyntaxTree *pSVar2;
  Function *this_00;
  GenerateFunction *pGVar3;
  uint uVar4;
  size_t sVar5;
  _List_node_base *p_Var6;
  ExpVarData_conflict exp_var_data;
  Guard l;
  Guard g;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  Guard local_50;
  
  local_98._8_8_ = 0;
  pcStack_80 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:810:9)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:810:9)>
             ::_M_manager;
  local_b8._8_8_ = 0;
  pcStack_a0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:810:9)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:810:9)>
             ::_M_manager;
  local_b8._M_unused._M_object = this;
  local_98._M_unused._M_object = this;
  Guard::Guard(&local_50,(function<void_()> *)&local_98,(function<void_()> *)&local_b8);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  pcStack_a0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:811:9)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:811:9)>
             ::_M_manager;
  local_78._8_8_ = 0;
  pcStack_60 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:811:9)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:811:9)>
             ::_M_manager;
  local_b8._M_unused._M_object = this;
  local_b8._8_8_ = while_stmt;
  local_78._M_unused._M_object = this;
  Guard::Guard((Guard *)&local_98,(function<void_()> *)&local_b8,(function<void_()> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  uVar4 = GenerateRegisterId(this);
  local_b8._4_4_ = uVar4 + 1;
  local_b8._0_4_ = uVar4;
  pSVar2 = (while_stmt->exp_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,this);
  this_00 = this->current_function_->function_;
  sVar5 = Function::AddInstruction
                    (this_00,(Instruction)((uVar4 & 0xff) << 0x10 | 0xf000000),
                     while_stmt->first_line_);
  pGVar3 = this->current_function_;
  p_Var6 = (_List_node_base *)operator_new(0x20);
  p_Var6[1]._M_next = (_List_node_base *)while_stmt;
  *(undefined4 *)&p_Var6[1]._M_prev = 1;
  *(int *)((long)&p_Var6[1]._M_prev + 4) = (int)sVar5;
  std::__detail::_List_node_base::_M_hook(p_Var6);
  psVar1 = &(pGVar3->loop_jumps_).
            super__List_base<luna::LoopJumpInfo,_std::allocator<luna::LoopJumpInfo>_>._M_impl.
            _M_node._M_size;
  *psVar1 = *psVar1 + 1;
  pSVar2 = (while_stmt->block_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,this,0);
  sVar5 = Function::AddInstruction(this_00,(Instruction)0x12000000,while_stmt->last_line_);
  pGVar3 = this->current_function_;
  p_Var6 = (_List_node_base *)operator_new(0x20);
  p_Var6[1]._M_next = (_List_node_base *)while_stmt;
  *(undefined4 *)&p_Var6[1]._M_prev = 0;
  *(int *)((long)&p_Var6[1]._M_prev + 4) = (int)sVar5;
  std::__detail::_List_node_base::_M_hook(p_Var6);
  psVar1 = &(pGVar3->loop_jumps_).
            super__List_base<luna::LoopJumpInfo,_std::allocator<luna::LoopJumpInfo>_>._M_impl.
            _M_node._M_size;
  *psVar1 = *psVar1 + 1;
  Guard::~Guard((Guard *)&local_98);
  Guard::~Guard(&local_50);
  return;
}

Assistant:

void CodeGenerateVisitor::Visit(WhileStatement *while_stmt, void *data)
    {
        CODE_GENERATE_GUARD(EnterBlock, LeaveBlock);
        LOOP_GUARD(while_stmt);

        auto register_id = GenerateRegisterId();
        ExpVarData exp_var_data{ register_id, register_id + 1 };
        while_stmt->exp_->Accept(this, &exp_var_data);

        // Jump to loop tail when expression is false
        auto function = GetCurrentFunction();
        auto instruction = Instruction::AsBxCode(OpType_JmpFalse, register_id, 0);
        int index = function->AddInstruction(instruction, while_stmt->first_line_);
        AddLoopJumpInfo(while_stmt, index, LoopJumpInfo::JumpTail);

        while_stmt->block_->Accept(this, nullptr);

        // Jump to loop head
        instruction = Instruction::AsBxCode(OpType_Jmp, 0, 0);
        index = function->AddInstruction(instruction, while_stmt->last_line_);
        AddLoopJumpInfo(while_stmt, index, LoopJumpInfo::JumpHead);
    }